

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTTP_Server.cpp
# Opt level: O2

int __thiscall Jupiter::HTTP::Server::think(Server *this)

{
  pointer puVar1;
  bool bVar2;
  int iVar3;
  Data *pDVar4;
  ssize_t sVar5;
  long lVar6;
  _If_sv<std::basic_string_view<char>,_size_type> _Var7;
  rep rVar8;
  iterator iVar9;
  Socket *this_00;
  size_type sVar10;
  HTTPSession *in_RCX;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  pointer puVar11;
  string_view *in_RSI;
  const_iterator __position;
  Socket *pSVar12;
  int in_R8D;
  pointer __old_p;
  __single_object session;
  string_view sock_buffer;
  string_view local_40;
  undefined4 extraout_var;
  
  pDVar4 = this->m_data;
  __position._M_current =
       (pDVar4->m_sessions).
       super__Vector_base<std::unique_ptr<HTTPSession,_std::default_delete<HTTPSession>_>,_std::allocator<std::unique_ptr<HTTPSession,_std::default_delete<HTTPSession>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  while (__position._M_current !=
         (pDVar4->m_sessions).
         super__Vector_base<std::unique_ptr<HTTPSession,_std::default_delete<HTTPSession>_>,_std::allocator<std::unique_ptr<HTTPSession,_std::default_delete<HTTPSession>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish) {
    bVar2 = Socket::isShutdown(&(((__position._M_current)->_M_t).
                                 super___uniq_ptr_impl<HTTPSession,_std::default_delete<HTTPSession>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_HTTPSession_*,_std::default_delete<HTTPSession>_>
                                 .super__Head_base<0UL,_HTTPSession_*,_false>._M_head_impl)->sock);
    if (bVar2) {
      sVar5 = Socket::recv(&(((__position._M_current)->_M_t).
                             super___uniq_ptr_impl<HTTPSession,_std::default_delete<HTTPSession>_>.
                             _M_t.
                             super__Tuple_impl<0UL,_HTTPSession_*,_std::default_delete<HTTPSession>_>
                             .super__Head_base<0UL,_HTTPSession_*,_false>._M_head_impl)->sock,
                           (int)in_RSI,__buf,(size_t)in_RCX,in_R8D);
      if ((int)sVar5 != 0) goto LAB_0013ba53;
LAB_0013bb32:
      pDVar4 = this->m_data;
LAB_0013bb36:
      iVar9 = std::
              vector<std::unique_ptr<HTTPSession,_std::default_delete<HTTPSession>_>,_std::allocator<std::unique_ptr<HTTPSession,_std::default_delete<HTTPSession>_>_>_>
              ::erase(&pDVar4->m_sessions,__position);
    }
    else {
      lVar6 = std::chrono::_V2::steady_clock::now();
      pDVar4 = this->m_data;
      in_RCX = ((__position._M_current)->_M_t).
               super___uniq_ptr_impl<HTTPSession,_std::default_delete<HTTPSession>_>._M_t.
               super__Tuple_impl<0UL,_HTTPSession_*,_std::default_delete<HTTPSession>_>.
               super__Head_base<0UL,_HTTPSession_*,_false>._M_head_impl;
      __buf_00 = (void *)((pDVar4->keep_alive_session_timeout).__r * 1000000 +
                         (in_RCX->last_active).__d.__r);
      if ((long)__buf_00 < lVar6) goto LAB_0013bb36;
      if (in_RCX->keep_alive == false) {
        lVar6 = std::chrono::_V2::steady_clock::now();
        pDVar4 = this->m_data;
        in_RCX = ((__position._M_current)->_M_t).
                 super___uniq_ptr_impl<HTTPSession,_std::default_delete<HTTPSession>_>._M_t.
                 super__Tuple_impl<0UL,_HTTPSession_*,_std::default_delete<HTTPSession>_>.
                 super__Head_base<0UL,_HTTPSession_*,_false>._M_head_impl;
        __buf_00 = (void *)((pDVar4->session_timeout).__r * 1000000 + (in_RCX->last_active).__d.__r)
        ;
        if ((long)__buf_00 < lVar6) goto LAB_0013bb36;
      }
      sVar5 = Socket::recv(&in_RCX->sock,(int)in_RSI,__buf_00,(size_t)in_RCX,in_R8D);
      if ((int)sVar5 < 1) {
        iVar3 = Socket::getLastError();
        if (iVar3 != 0xb) goto LAB_0013bb32;
      }
      else {
        sock_buffer = Socket::getBuffer(&(((__position._M_current)->_M_t).
                                          super___uniq_ptr_impl<HTTPSession,_std::default_delete<HTTPSession>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_HTTPSession_*,_std::default_delete<HTTPSession>_>
                                          .super__Head_base<0UL,_HTTPSession_*,_false>._M_head_impl)
                                         ->sock);
        in_RCX = ((__position._M_current)->_M_t).
                 super___uniq_ptr_impl<HTTPSession,_std::default_delete<HTTPSession>_>._M_t.
                 super__Tuple_impl<0UL,_HTTPSession_*,_std::default_delete<HTTPSession>_>.
                 super__Head_base<0UL,_HTTPSession_*,_false>._M_head_impl;
        pDVar4 = this->m_data;
        if (pDVar4->max_request_size < (in_RCX->request)._M_string_length + sock_buffer._M_len)
        goto LAB_0013bb36;
        in_RCX = (HTTPSession *)&in_RCX->request;
        std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
                  ((string *)in_RCX,&sock_buffer);
        in_RSI = &HTTP_REQUEST_ENDING;
        _Var7 = std::__cxx11::string::find<std::basic_string_view<char,std::char_traits<char>>>
                          ((string *)
                           &(((__position._M_current)->_M_t).
                             super___uniq_ptr_impl<HTTPSession,_std::default_delete<HTTPSession>_>.
                             _M_t.
                             super__Tuple_impl<0UL,_HTTPSession_*,_std::default_delete<HTTPSession>_>
                             .super__Head_base<0UL,_HTTPSession_*,_false>._M_head_impl)->request,
                           &HTTP_REQUEST_ENDING,0);
        if (_Var7 == 0xffffffffffffffff) {
          pDVar4 = this->m_data;
          if (((((__position._M_current)->_M_t).
                super___uniq_ptr_impl<HTTPSession,_std::default_delete<HTTPSession>_>._M_t.
                super__Tuple_impl<0UL,_HTTPSession_*,_std::default_delete<HTTPSession>_>.
                super__Head_base<0UL,_HTTPSession_*,_false>._M_head_impl)->request)._M_string_length
              == pDVar4->max_request_size) goto LAB_0013bb36;
        }
        else {
          rVar8 = std::chrono::_V2::steady_clock::now();
          in_RSI = (string_view *)
                   ((__position._M_current)->_M_t).
                   super___uniq_ptr_impl<HTTPSession,_std::default_delete<HTTPSession>_>._M_t.
                   super__Tuple_impl<0UL,_HTTPSession_*,_std::default_delete<HTTPSession>_>.
                   super__Head_base<0UL,_HTTPSession_*,_false>._M_head_impl;
          (((HTTPSession *)in_RSI)->last_active).__d.__r = rVar8;
          Data::process_request(this->m_data,(HTTPSession *)in_RSI);
          if ((((__position._M_current)->_M_t).
               super___uniq_ptr_impl<HTTPSession,_std::default_delete<HTTPSession>_>._M_t.
               super__Tuple_impl<0UL,_HTTPSession_*,_std::default_delete<HTTPSession>_>.
               super__Head_base<0UL,_HTTPSession_*,_false>._M_head_impl)->keep_alive == false)
          goto LAB_0013bb32;
        }
      }
LAB_0013ba53:
      iVar9._M_current = __position._M_current + 1;
      __position._M_current = (unique_ptr<HTTPSession,_std::default_delete<HTTPSession>_> *)in_RSI;
    }
    pDVar4 = this->m_data;
    in_RSI = (string_view *)__position._M_current;
    __position._M_current = iVar9._M_current;
  }
  puVar11 = (pDVar4->m_ports).
            super__Vector_base<std::unique_ptr<Jupiter::Socket,_std::default_delete<Jupiter::Socket>_>,_std::allocator<std::unique_ptr<Jupiter::Socket,_std::default_delete<Jupiter::Socket>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (pDVar4->m_ports).
           super__Vector_base<std::unique_ptr<Jupiter::Socket,_std::default_delete<Jupiter::Socket>_>,_std::allocator<std::unique_ptr<Jupiter::Socket,_std::default_delete<Jupiter::Socket>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pSVar12 = (Socket *)0x0;
  do {
    if (puVar11 == puVar1) {
      if (pSVar12 != (Socket *)0x0) {
        (*pSVar12->_vptr_Socket[0xe])(pSVar12);
      }
      return 0;
    }
    iVar3 = (*((puVar11->_M_t).
               super___uniq_ptr_impl<Jupiter::Socket,_std::default_delete<Jupiter::Socket>_>._M_t.
               super__Tuple_impl<0UL,_Jupiter::Socket_*,_std::default_delete<Jupiter::Socket>_>.
               super__Head_base<0UL,_Jupiter::Socket_*,_false>._M_head_impl)->_vptr_Socket[3])();
    this_00 = (Socket *)CONCAT44(extraout_var,iVar3);
    if (pSVar12 != (Socket *)0x0) {
      (*pSVar12->_vptr_Socket[0xe])(pSVar12);
    }
    if (this_00 != (Socket *)0x0) {
      Socket::setBlocking(this_00,false);
      pSVar12 = this_00;
      std::make_unique<HTTPSession,Jupiter::Socket>((Socket *)&session);
      sVar5 = Socket::recv((Socket *)
                           session._M_t.
                           super___uniq_ptr_impl<HTTPSession,_std::default_delete<HTTPSession>_>.
                           _M_t.
                           super__Tuple_impl<0UL,_HTTPSession_*,_std::default_delete<HTTPSession>_>.
                           super__Head_base<0UL,_HTTPSession_*,_false>._M_head_impl,(int)pSVar12,
                           __buf_01,(size_t)in_RCX,in_R8D);
      if ((int)sVar5 < 1) {
        iVar3 = Socket::getLastError();
        if (iVar3 == 0xb) {
          std::
          vector<std::unique_ptr<HTTPSession,std::default_delete<HTTPSession>>,std::allocator<std::unique_ptr<HTTPSession,std::default_delete<HTTPSession>>>>
          ::emplace_back<std::unique_ptr<HTTPSession,std::default_delete<HTTPSession>>>
                    ((vector<std::unique_ptr<HTTPSession,std::default_delete<HTTPSession>>,std::allocator<std::unique_ptr<HTTPSession,std::default_delete<HTTPSession>>>>
                      *)&this->m_data->m_sessions,&session);
        }
      }
      else {
        sock_buffer = Socket::getBuffer((Socket *)
                                        session._M_t.
                                        super___uniq_ptr_impl<HTTPSession,_std::default_delete<HTTPSession>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_HTTPSession_*,_std::default_delete<HTTPSession>_>
                                        .super__Head_base<0UL,_HTTPSession_*,_false>._M_head_impl);
        in_RCX = (HTTPSession *)this->m_data->max_request_size;
        if ((HTTPSession *)sock_buffer._M_len < in_RCX) {
          local_40 = Socket::getBuffer((Socket *)
                                       session._M_t.
                                       super___uniq_ptr_impl<HTTPSession,_std::default_delete<HTTPSession>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_HTTPSession_*,_std::default_delete<HTTPSession>_>
                                       .super__Head_base<0UL,_HTTPSession_*,_false>._M_head_impl);
          std::__cxx11::string::assign<std::basic_string_view<char,std::char_traits<char>>>
                    ((string *)
                     ((long)session._M_t.
                            super___uniq_ptr_impl<HTTPSession,_std::default_delete<HTTPSession>_>.
                            _M_t.
                            super__Tuple_impl<0UL,_HTTPSession_*,_std::default_delete<HTTPSession>_>
                            .super__Head_base<0UL,_HTTPSession_*,_false>._M_head_impl + 0x10),
                     &local_40);
          in_RCX = (HTTPSession *)0x4;
          sVar10 = std::basic_string_view<char,_std::char_traits<char>_>::find
                             (&sock_buffer,"\r\n\r\n",0,4);
          pDVar4 = this->m_data;
          if (sVar10 != 0xffffffffffffffff) {
            Data::process_request
                      (pDVar4,(HTTPSession *)
                              session._M_t.
                              super___uniq_ptr_impl<HTTPSession,_std::default_delete<HTTPSession>_>.
                              _M_t.
                              super__Tuple_impl<0UL,_HTTPSession_*,_std::default_delete<HTTPSession>_>
                              .super__Head_base<0UL,_HTTPSession_*,_false>._M_head_impl);
LAB_0013bca6:
            if (*(char *)((long)session._M_t.
                                super___uniq_ptr_impl<HTTPSession,_std::default_delete<HTTPSession>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_HTTPSession_*,_std::default_delete<HTTPSession>_>
                                .super__Head_base<0UL,_HTTPSession_*,_false>._M_head_impl + 0x30) !=
                '\x01') goto LAB_0013bcc0;
            pDVar4 = this->m_data;
          }
          std::
          vector<std::unique_ptr<HTTPSession,std::default_delete<HTTPSession>>,std::allocator<std::unique_ptr<HTTPSession,std::default_delete<HTTPSession>>>>
          ::emplace_back<std::unique_ptr<HTTPSession,std::default_delete<HTTPSession>>>
                    ((vector<std::unique_ptr<HTTPSession,std::default_delete<HTTPSession>>,std::allocator<std::unique_ptr<HTTPSession,std::default_delete<HTTPSession>>>>
                      *)&pDVar4->m_sessions,&session);
        }
        else if ((HTTPSession *)sock_buffer._M_len == in_RCX) {
          in_RCX = (HTTPSession *)0x4;
          sVar10 = std::basic_string_view<char,_std::char_traits<char>_>::find
                             (&sock_buffer,"\r\n\r\n",0,4);
          if (sVar10 != 0xffffffffffffffff) {
            local_40 = Socket::getBuffer((Socket *)
                                         session._M_t.
                                         super___uniq_ptr_impl<HTTPSession,_std::default_delete<HTTPSession>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_HTTPSession_*,_std::default_delete<HTTPSession>_>
                                         .super__Head_base<0UL,_HTTPSession_*,_false>._M_head_impl);
            std::__cxx11::string::assign<std::basic_string_view<char,std::char_traits<char>>>
                      ((string *)
                       ((long)session._M_t.
                              super___uniq_ptr_impl<HTTPSession,_std::default_delete<HTTPSession>_>.
                              _M_t.
                              super__Tuple_impl<0UL,_HTTPSession_*,_std::default_delete<HTTPSession>_>
                              .super__Head_base<0UL,_HTTPSession_*,_false>._M_head_impl + 0x10),
                       &local_40);
            Data::process_request
                      (this->m_data,
                       (HTTPSession *)
                       session._M_t.
                       super___uniq_ptr_impl<HTTPSession,_std::default_delete<HTTPSession>_>._M_t.
                       super__Tuple_impl<0UL,_HTTPSession_*,_std::default_delete<HTTPSession>_>.
                       super__Head_base<0UL,_HTTPSession_*,_false>._M_head_impl);
            goto LAB_0013bca6;
          }
        }
      }
LAB_0013bcc0:
      std::unique_ptr<HTTPSession,_std::default_delete<HTTPSession>_>::~unique_ptr(&session);
    }
    puVar11 = puVar11 + 1;
    pSVar12 = this_00;
  } while( true );
}

Assistant:

int Jupiter::HTTP::Server::think() {
	// Process existing clients
	for (auto itr = m_data->m_sessions.begin(); itr != m_data->m_sessions.end();) {
		auto& session = *itr;
		if (session->sock.isShutdown()) {
			if (session->sock.recv() == 0) {
				itr = m_data->m_sessions.erase(itr);
				continue;
			}
		}
		else if ((std::chrono::steady_clock::now() > session->last_active + m_data->keep_alive_session_timeout)
			|| (session->keep_alive == false && std::chrono::steady_clock::now() > session->last_active + m_data->session_timeout)) {
			itr = m_data->m_sessions.erase(itr);
			continue;
		}
		else if (session->sock.recv() > 0) {
			std::string_view sock_buffer = session->sock.getBuffer();
			if (session->request.size() + sock_buffer.size() <= m_data->max_request_size) { // accept
				session->request += sock_buffer;
				if (session->request.find(HTTP_REQUEST_ENDING) != std::string::npos) { // completed request
					session->last_active = std::chrono::steady_clock::now();
					m_data->process_request(*session);
					if (session->keep_alive == false) { // remove completed session
						itr = m_data->m_sessions.erase(itr);
						//session->sock.shutdown();
						continue;
					}
					// else // keep_alive: session not deleted
				}
				else if (session->request.size() == m_data->max_request_size) { // reject (full buffer)
					itr = m_data->m_sessions.erase(itr);
					continue;
				}
				// else // request not over: session not deleted
			}
			else { // reject
				itr = m_data->m_sessions.erase(itr);
				continue;
			}
		}
		else if (session->sock.getLastError() != JUPITER_SOCK_EWOULDBLOCK) {
			itr = m_data->m_sessions.erase(itr);
			continue;
		}
		// else // EWOULDBLOCK: session not deleted

		++itr;
	}

	// Process incoming clients
	std::unique_ptr<Jupiter::Socket> socket;
	for (auto& port : m_data->m_ports) {
		socket.reset(port->accept());
		if (socket != nullptr) {
			socket->setBlocking(false);
			auto session = std::make_unique<HTTPSession>(std::move(*socket));
			if (session->sock.recv() > 0) { // data received
				std::string_view sock_buffer = session->sock.getBuffer();
				if (sock_buffer.size() < m_data->max_request_size) { // accept
					session->request = session->sock.getBuffer();
					if (sock_buffer.find(HTTP_REQUEST_ENDING) != std::string_view::npos) { // completed request
						m_data->process_request(*session);
						if (session->keep_alive) { // session will live for 30 seconds.
							m_data->m_sessions.push_back(std::move(session));
						}
						// else // session completed
					}
					else { // store for more processing
						m_data->m_sessions.push_back(std::move(session));
					}
				}
				else if (sock_buffer.size() == m_data->max_request_size) {
					if (sock_buffer.find(HTTP_REQUEST_ENDING) == std::string_view::npos) { // reject (too large)
						continue;
					}

					// accept (max size, completed request)
					session->request = session->sock.getBuffer();
					m_data->process_request(*session);
					if (session->keep_alive) { // session will live for 30 seconds.
						m_data->m_sessions.push_back(std::move(session));
					}
					// else // session completed
				}
				// else // reject (too large)
			}
			else if (session->sock.getLastError() == JUPITER_SOCK_EWOULDBLOCK) { // store for more processing
				m_data->m_sessions.push_back(std::move(session));
			}
		}
	}
	return 0;
}